

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<duckdb::BoundOrderModifier>(Serializer *this,BoundOrderModifier *ptr)

{
  Serializer *in_RSI;
  BoundOrderModifier *in_RDI;
  
  if (in_RSI == (Serializer *)0x0) {
    (*(in_RDI->super_BoundResultModifier)._vptr_BoundResultModifier[10])(in_RDI,0);
    (*(in_RDI->super_BoundResultModifier)._vptr_BoundResultModifier[0xb])();
  }
  else {
    (*(in_RDI->super_BoundResultModifier)._vptr_BoundResultModifier[10])(in_RDI,1);
    WriteValue<duckdb::BoundOrderModifier>(in_RSI,in_RDI);
    (*(in_RDI->super_BoundResultModifier)._vptr_BoundResultModifier[0xb])();
  }
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}